

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O2

vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_> * __thiscall
clara::detail::Parser::getHelpColumns
          (vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>
           *__return_storage_ptr__,Parser *this)

{
  pointer pOVar1;
  pointer this_00;
  vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_> childCols;
  vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar1 = (this->m_options).
           super__Vector_base<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_options).
                 super__Vector_base<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>._M_impl
                 .super__Vector_impl_data._M_start; this_00 != pOVar1; this_00 = this_00 + 1) {
    Opt::getHelpColumns(&local_38,this_00);
    std::vector<clara::detail::HelpColumns,std::allocator<clara::detail::HelpColumns>>::
    insert<__gnu_cxx::__normal_iterator<clara::detail::HelpColumns*,std::vector<clara::detail::HelpColumns,std::allocator<clara::detail::HelpColumns>>>,void>
              ((vector<clara::detail::HelpColumns,std::allocator<clara::detail::HelpColumns>> *)
               __return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<clara::detail::HelpColumns_*,_std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>_>
                )local_38.
                 super__Vector_base<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<clara::detail::HelpColumns_*,_std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>_>
                )local_38.
                 super__Vector_base<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<clara::detail::HelpColumns,_std::allocator<clara::detail::HelpColumns>_>::~vector
              (&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

auto getHelpColumns() const -> std::vector<HelpColumns> {
            std::vector<HelpColumns> cols;
            for (auto const &o : m_options) {
                auto childCols = o.getHelpColumns();
                cols.insert( cols.end(), childCols.begin(), childCols.end() );
            }
            return cols;
        }